

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_num
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  char cVar1;
  char cVar2;
  uint size;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  basic_format_specs<char> *in_R8;
  ulong uVar9;
  size_t new_size;
  char *pcVar10;
  basic_string_view<char> s;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  locale_ref in_stack_fffffffffffffd78;
  locale_ref in_stack_fffffffffffffd80;
  char acStack_269 [49];
  undefined1 local_238 [536];
  
  grouping_impl<char>(in_stack_fffffffffffffd80);
  if (in_stack_fffffffffffffd80.locale_ == (void *)0x0) {
    on_dec(this);
  }
  else {
    cVar2 = thousands_sep_impl<char>(in_stack_fffffffffffffd78);
    if (cVar2 != '\0') {
      size = count_digits(this->abs_value);
      uVar9 = (ulong)size;
      iVar4 = (int)in_stack_fffffffffffffd80.locale_ + size;
      pvVar6 = (void *)0x0;
      uVar8 = size;
      do {
        if (in_stack_fffffffffffffd80.locale_ == pvVar6) {
LAB_001156c8:
          iVar4 = (int)(uVar8 - 1) /
                  (int)((char *)((long)in_stack_fffffffffffffd78.locale_ + -1))
                       [(long)in_stack_fffffffffffffd80.locale_] + iVar4;
LAB_001156d8:
          format_decimal<char,unsigned_int>(acStack_269 + 1,this->abs_value,size);
          local_238._8_8_ = local_238 + 0x20;
          local_238._16_8_ = (char *)0x0;
          local_238._0_8_ = &PTR_grow_00134cc8;
          local_238._24_8_ = 500;
          new_size = (size_t)(int)(iVar4 + this->prefix_size);
          buffer<char>::resize((buffer<char> *)local_238,new_size);
          iVar4 = 0;
          pcVar3 = (char *)((long)(_func_int ***)local_238._8_8_ + new_size);
          pcVar5 = (char *)in_stack_fffffffffffffd78.locale_;
          do {
            pcVar10 = pcVar3 + -1;
            do {
              pcVar3 = pcVar10;
              if ((int)uVar9 < 1) {
                if (this->prefix_size != 0) {
                  *pcVar3 = '-';
                }
                s.size_ = (size_t)this->specs;
                s.data_ = (char *)local_238._16_8_;
                write<char,char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                          ((detail *)(this->out).container,
                           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_238._8_8_,s,
                           in_R8);
                basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                          ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_238);
                goto LAB_001157ab;
              }
              pcVar10 = acStack_269 + uVar9;
              uVar9 = uVar9 - 1;
              *pcVar3 = *pcVar10;
              uVar8 = (uint)*pcVar5;
              in_R8 = (basic_format_specs<char> *)(ulong)uVar8;
              pcVar10 = pcVar3 + -1;
            } while ((int)uVar8 < 1);
            iVar4 = iVar4 + 1;
            if ((*pcVar5 != '\x7f') && (iVar4 % (int)uVar8 == 0)) {
              if (pcVar5 + 1 !=
                  (char *)((long)in_stack_fffffffffffffd78.locale_ +
                          (long)in_stack_fffffffffffffd80.locale_)) {
                iVar4 = 0;
                pcVar5 = pcVar5 + 1;
              }
              *pcVar10 = cVar2;
              pcVar3 = pcVar10;
            }
          } while( true );
        }
        cVar1 = *(char *)((long)in_stack_fffffffffffffd78.locale_ + (long)pvVar6);
        uVar7 = uVar8 - (int)cVar1;
        in_R8 = (basic_format_specs<char> *)(ulong)uVar7;
        if ((uVar7 == 0 || (int)uVar8 < (int)cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) {
          iVar4 = size + (int)pvVar6;
          if (in_stack_fffffffffffffd80.locale_ != pvVar6) goto LAB_001156d8;
          goto LAB_001156c8;
        }
        pvVar6 = (void *)((long)pvVar6 + 1);
        uVar8 = uVar7;
      } while( true );
    }
    on_dec(this);
  }
LAB_001157ab:
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    buffer.resize(size);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    write(out, basic_string_view<Char>(buffer.data(), buffer.size()), specs);
  }